

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_encoder.cc
# Opt level: O1

bool __thiscall
draco::MetadataEncoder::EncodeGeometryMetadata
          (MetadataEncoder *this,EncoderBuffer *out_buffer,GeometryMetadata *metadata)

{
  pointer puVar1;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *att_metadata
  ;
  pointer puVar2;
  
  if (metadata != (GeometryMetadata *)0x0) {
    EncodeVarint<unsigned_int>
              ((uint)((ulong)((long)(metadata->att_metadatas_).
                                    super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(metadata->att_metadatas_).
                                   super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3),out_buffer);
    puVar1 = (metadata->att_metadatas_).
             super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar2 = (metadata->att_metadatas_).
                  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      EncodeAttributeMetadata
                (this,out_buffer,
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
    }
    EncodeMetadata(this,out_buffer,&metadata->super_Metadata);
  }
  return metadata != (GeometryMetadata *)0x0;
}

Assistant:

bool MetadataEncoder::EncodeGeometryMetadata(EncoderBuffer *out_buffer,
                                             const GeometryMetadata *metadata) {
  if (!metadata) {
    return false;
  }
  // Encode number of attribute metadata.
  const std::vector<std::unique_ptr<AttributeMetadata>> &att_metadatas =
      metadata->attribute_metadatas();
  // TODO(draco-eng): Limit the number of attributes.
  EncodeVarint(static_cast<uint32_t>(att_metadatas.size()), out_buffer);
  // Encode each attribute metadata
  for (auto &&att_metadata : att_metadatas) {
    EncodeAttributeMetadata(out_buffer, att_metadata.get());
  }
  // Encode normal metadata part.
  EncodeMetadata(out_buffer, static_cast<const Metadata *>(metadata));

  return true;
}